

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackTexture.cpp
# Opt level: O3

void __thiscall Rml::CallbackTextureInterface::SaveLayerAsTexture(CallbackTextureInterface *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *msg;
  Vector2i VVar4;
  Rectanglei RVar5;
  
  if (*this->texture_handle == 0) {
    RVar5 = RenderManager::GetScissorRegion(this->render_manager);
    if (RVar5.p0.x <= RVar5.p1.x && RVar5.p0.y <= RVar5.p1.y) {
      iVar3 = (*this->render_interface->_vptr_RenderInterface[0x10])();
      *this->texture_handle = CONCAT44(extraout_var,iVar3);
      if (CONCAT44(extraout_var,iVar3) == 0) {
        return;
      }
      VVar4.x = RVar5.p1.x - RVar5.p0.x;
      VVar4.y = RVar5.p1.y - RVar5.p0.y;
      *this->dimensions = VVar4;
      return;
    }
    msg = "Save layer as texture requires a scissor region to be set first";
    iVar3 = 0x4d;
  }
  else {
    msg = "Texture already set";
    iVar3 = 0x46;
  }
  bVar2 = Assert(msg,
                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/CallbackTexture.cpp"
                 ,iVar3);
  if (bVar2) {
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void CallbackTextureInterface::SaveLayerAsTexture() const
{
	if (texture_handle)
	{
		RMLUI_ERRORMSG("Texture already set");
		return;
	}

	const Rectanglei region = render_manager.GetScissorRegion();
	if (!region.Valid())
	{
		RMLUI_ERRORMSG("Save layer as texture requires a scissor region to be set first");
		return;
	}

	texture_handle = render_interface.SaveLayerAsTexture();
	if (texture_handle)
		dimensions = region.Size();
}